

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::get_cbor_object(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  *this,size_t len)

{
  bool bVar1;
  int iVar2;
  byte local_6a;
  byte local_62;
  ulong local_48;
  size_t i;
  string_t key;
  size_t len_local;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  *this_local;
  
  key.field_2._8_8_ = len;
  bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::start_object(this->sax,len);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&i);
    if (key.field_2._8_8_ == -1) {
      while (iVar2 = get(this), iVar2 != 0xff) {
        bVar1 = get_cbor_string(this,(string_t *)&i);
        local_6a = 1;
        if (bVar1) {
          bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::key(this->sax,(string_t *)&i);
          local_6a = bVar1 ^ 0xff;
        }
        if ((local_6a & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_0013f865;
        }
        bVar1 = parse_cbor_internal(this,true);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_0013f865;
        }
        std::__cxx11::string::clear();
      }
    }
    else {
      for (local_48 = 0; local_48 < (ulong)key.field_2._8_8_; local_48 = local_48 + 1) {
        get(this);
        bVar1 = get_cbor_string(this,(string_t *)&i);
        local_62 = 1;
        if (bVar1) {
          bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::key(this->sax,(string_t *)&i);
          local_62 = bVar1 ^ 0xff;
        }
        if ((local_62 & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_0013f865;
        }
        bVar1 = parse_cbor_internal(this,true);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_0013f865;
        }
        std::__cxx11::string::clear();
      }
    }
    this_local._7_1_ =
         json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         ::end_object(this->sax);
LAB_0013f865:
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool get_cbor_object(const std::size_t len)
    {
        if (JSON_HEDLEY_UNLIKELY(not sax->start_object(len)))
        {
            return false;
        }

        string_t key;
        if (len != std::size_t(-1))
        {
            for (std::size_t i = 0; i < len; ++i)
            {
                get();
                if (JSON_HEDLEY_UNLIKELY(not get_cbor_string(key) or not sax->key(key)))
                {
                    return false;
                }

                if (JSON_HEDLEY_UNLIKELY(not parse_cbor_internal()))
                {
                    return false;
                }
                key.clear();
            }
        }
        else
        {
            while (get() != 0xFF)
            {
                if (JSON_HEDLEY_UNLIKELY(not get_cbor_string(key) or not sax->key(key)))
                {
                    return false;
                }

                if (JSON_HEDLEY_UNLIKELY(not parse_cbor_internal()))
                {
                    return false;
                }
                key.clear();
            }
        }

        return sax->end_object();
    }